

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpu_mips_store_cause_mips(CPUMIPSState *env,target_ulong_conflict val)

{
  uint local_18;
  uint32_t mask;
  target_ulong_conflict val_local;
  CPUMIPSState *env_local;
  
  local_18 = 0xc00300;
  if ((env->insn_flags & 0x40) != 0) {
    local_18 = 0x8c00300;
  }
  if ((env->insn_flags & 0x2000) != 0) {
    local_18 = (val & 0x400000 ^ 0xffffffff) & local_18;
  }
  env->CP0_Cause = env->CP0_Cause & (local_18 ^ 0xffffffff) | val & local_18;
  return;
}

Assistant:

void cpu_mips_store_cause(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = 0x00C00300;

    if (env->insn_flags & ISA_MIPS32R2) {
        mask |= 1 << CP0Ca_DC;
    }
    if (env->insn_flags & ISA_MIPS32R6) {
        mask &= ~((1 << CP0Ca_WP) & val);
    }

    env->CP0_Cause = (env->CP0_Cause & ~mask) | (val & mask);

#if 0
    uint32_t old = env->CP0_Cause;
    if ((old ^ env->CP0_Cause) & (1 << CP0Ca_DC)) {
        if (env->CP0_Cause & (1 << CP0Ca_DC)) {
            cpu_mips_stop_count(env);
        } else {
            cpu_mips_start_count(env);
        }
    }

    int i;
    /* Set/reset software interrupts */
    for (i = 0 ; i < 2 ; i++) {
        if ((old ^ env->CP0_Cause) & (1 << (CP0Ca_IP + i))) {
            cpu_mips_soft_irq(env, i, env->CP0_Cause & (1 << (CP0Ca_IP + i)));
        }
    }
#endif
}